

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O3

uint * Cec_ManComputeInitState(Gia_Man_t *pAig,int nFrames)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Vec_Int_t *pVVar8;
  long lVar9;
  uint *puVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  
  Gia_ManRandom(1);
  uVar6 = pAig->nRegs;
  if (0 < (int)uVar6) {
    iVar5 = 0;
    do {
      iVar7 = pAig->vCis->nSize;
      uVar12 = (iVar7 - uVar6) + iVar5;
      if (((int)uVar12 < 0) || (iVar7 <= (int)uVar12)) goto LAB_005aef23;
      iVar7 = pAig->vCis->pArray[uVar12];
      if (((long)iVar7 < 0) || (pAig->nObjs <= iVar7)) goto LAB_005aef04;
      if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = pAig->pObjs + iVar7;
      *(ulong *)pGVar4 = *(ulong *)pGVar4 & 0xbfffffffffffffff;
      iVar5 = iVar5 + 1;
      uVar6 = pAig->nRegs;
    } while (iVar5 < (int)uVar6);
  }
  if (0 < nFrames) {
    iVar5 = 0;
    do {
      *(ulong *)pAig->pObjs = *(ulong *)pAig->pObjs & 0xbfffffffffffffff;
      uVar6 = pAig->nRegs;
      pVVar8 = pAig->vCis;
      iVar7 = pVVar8->nSize;
      if ((int)uVar6 < iVar7) {
        lVar13 = 0;
        do {
          if (iVar7 <= lVar13) goto LAB_005aef23;
          lVar9 = (long)pVVar8->pArray[lVar13];
          if ((lVar9 < 0) || (iVar7 = pAig->nObjs, iVar7 <= pVVar8->pArray[lVar13]))
          goto LAB_005aef04;
          pGVar4 = pAig->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) goto LAB_005aec55;
          uVar6 = Gia_ManRandom(0);
          *(ulong *)(pGVar4 + lVar9) =
               *(ulong *)(pGVar4 + lVar9) & 0xbfffffffffffffff | (ulong)(uVar6 & 1) << 0x3e;
          lVar13 = lVar13 + 1;
          uVar6 = pAig->nRegs;
          pVVar8 = pAig->vCis;
          iVar7 = pVVar8->nSize;
        } while (lVar13 < (int)(iVar7 - uVar6));
      }
      iVar7 = pAig->nObjs;
      if (0 < iVar7) {
LAB_005aec55:
        lVar13 = 0;
        lVar9 = 0;
        do {
          pGVar4 = pAig->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          uVar11 = *(ulong *)(&pGVar4->field_0x0 + lVar13);
          if ((uVar11 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar11) {
            *(ulong *)(&pGVar4->field_0x0 + lVar13) =
                 uVar11 & 0xbfffffff7fffffff |
                 ((ulong)(((uint)(uVar11 >> 0x3d) ^
                          (uint)((ulong)*(undefined8 *)
                                         ((long)pGVar4 +
                                         (ulong)((uint)(uVar11 >> 0x1e) & 0x7ffffffc) * -3 + lVar13)
                                >> 0x3e)) &
                         ((uint)((ulong)*(undefined8 *)
                                         ((long)pGVar4 +
                                         (ulong)(uint)((int)(uVar11 & 0x1fffffff) << 2) * -3 +
                                         lVar13) >> 0x3e) ^ (uint)(uVar11 >> 0x1d) & 7)) & 1) <<
                 0x3e;
            iVar7 = pAig->nObjs;
          }
          lVar9 = lVar9 + 1;
          lVar13 = lVar13 + 0xc;
        } while (lVar9 < iVar7);
        uVar6 = pAig->nRegs;
      }
      if (0 < (int)uVar6) {
        iVar7 = 0;
        do {
          iVar2 = pAig->vCos->nSize;
          uVar12 = (iVar2 - uVar6) + iVar7;
          if (((int)uVar12 < 0) || (iVar2 <= (int)uVar12)) goto LAB_005aef23;
          iVar2 = pAig->vCos->pArray[uVar12];
          if (((long)iVar2 < 0) || (pAig->nObjs <= iVar2)) goto LAB_005aef04;
          if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar4 = pAig->pObjs + iVar2;
          uVar11 = *(ulong *)pGVar4;
          *(ulong *)pGVar4 =
               uVar11 & 0xbfffffffffffffff |
               (uVar11 << 0x21 ^ *(ulong *)(pGVar4 + -(ulong)((uint)uVar11 & 0x1fffffff))) &
               0x4000000000000000;
          iVar7 = iVar7 + 1;
          uVar6 = pAig->nRegs;
        } while (iVar7 < (int)uVar6);
        if (0 < (int)uVar6) {
          iVar7 = 0;
          do {
            iVar2 = pAig->vCos->nSize;
            uVar12 = (iVar2 - uVar6) + iVar7;
            if (((int)uVar12 < 0) || (iVar2 <= (int)uVar12)) goto LAB_005aef23;
            iVar2 = pAig->vCos->pArray[uVar12];
            if (((long)iVar2 < 0) || (pAig->nObjs <= iVar2)) goto LAB_005aef04;
            pGVar4 = pAig->pObjs;
            if (pGVar4 == (Gia_Obj_t *)0x0) break;
            iVar3 = pAig->vCis->nSize;
            uVar6 = (iVar3 - uVar6) + iVar7;
            if (((int)uVar6 < 0) || (iVar3 <= (int)uVar6)) goto LAB_005aef23;
            uVar6 = pAig->vCis->pArray[uVar6];
            lVar13 = (long)(int)uVar6;
            if ((lVar13 < 0) || ((uint)pAig->nObjs <= uVar6)) goto LAB_005aef04;
            *(ulong *)(pGVar4 + lVar13) =
                 *(ulong *)(pGVar4 + lVar13) & 0xbfffffffffffffff |
                 *(ulong *)(pGVar4 + iVar2) & 0x4000000000000000;
            iVar7 = iVar7 + 1;
            uVar6 = pAig->nRegs;
          } while (iVar7 < (int)uVar6);
        }
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != nFrames);
  }
  puVar10 = (uint *)calloc((long)(int)((((int)uVar6 >> 5) + 1) - (uint)((uVar6 & 0x1f) == 0)),4);
  if (0 < (int)uVar6) {
    pVVar8 = pAig->vCis;
    iVar5 = pVVar8->nSize;
    uVar11 = 0;
    do {
      uVar1 = (iVar5 - uVar6) + uVar11;
      iVar7 = (int)uVar1;
      if ((iVar7 < 0) || (iVar5 <= iVar7)) {
LAB_005aef23:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar7 = pVVar8->pArray[uVar1 & 0xffffffff];
      if (((long)iVar7 < 0) || (pAig->nObjs <= iVar7)) {
LAB_005aef04:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
      if (((undefined1  [12])pAig->pObjs[iVar7] & (undefined1  [12])0x4000000000000000) !=
          (undefined1  [12])0x0) {
        puVar10[uVar11 >> 5 & 0x7ffffff] =
             puVar10[uVar11 >> 5 & 0x7ffffff] | 1 << ((byte)uVar11 & 0x1f);
      }
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
  }
  Gia_ManCleanMark1(pAig);
  return puVar10;
}

Assistant:

unsigned * Cec_ManComputeInitState( Gia_Man_t * pAig, int nFrames )
{  
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    unsigned * pInitState;
    int i, f; 
    Gia_ManRandom( 1 );
//    Abc_Print( 1, "Simulating %d timeframes.\n", nFrames );
    Gia_ManForEachRo( pAig, pObj, i )
        pObj->fMark1 = 0;
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ManConst0(pAig)->fMark1 = 0;
        Gia_ManForEachPi( pAig, pObj, i )
            pObj->fMark1 = Gia_ManRandom(0) & 1;
        Gia_ManForEachAnd( pAig, pObj, i )
            pObj->fMark1 = (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) & 
                (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachRi( pAig, pObj, i )
            pObj->fMark1 = (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj));
        Gia_ManForEachRiRo( pAig, pObjRi, pObjRo, i )
            pObjRo->fMark1 = pObjRi->fMark1;
    }
    pInitState = ABC_CALLOC( unsigned, Abc_BitWordNum(Gia_ManRegNum(pAig)) );
    Gia_ManForEachRo( pAig, pObj, i )
    {
        if ( pObj->fMark1 )
            Abc_InfoSetBit( pInitState, i );
//        Abc_Print( 1, "%d", pObj->fMark1 );
    }
//    Abc_Print( 1, "\n" );
    Gia_ManCleanMark1( pAig );
    return pInitState;
}